

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O1

bool bssl::dtls_seal_record
               (SSL *ssl,DTLSRecordNumber *out_number,uint8_t *out,size_t *out_len,size_t max_out,
               uint8_t type,uint8_t *in,size_t in_len,uint16_t epoch)

{
  byte bVar1;
  ushort uVar2;
  DTLS1_STATE *pDVar3;
  ulong uVar4;
  SSLAEADContext *this;
  RecordNumberEncrypter *pRVar5;
  Span<const_unsigned_char> header;
  size_t *psVar6;
  bool bVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  int iVar10;
  size_t sVar11;
  ushort *puVar12;
  ulong seqnum;
  uchar *puVar13;
  long lVar14;
  uintptr_t b_u;
  uintptr_t a_u;
  uint8_t type_00;
  int line;
  ulong uVar15;
  uint8_t *out_00;
  uint8_t *out_prefix;
  DTLSWriteEpoch *pDVar16;
  Span<const_unsigned_char> in_00;
  uint8_t mask [2];
  size_t ciphertext_len;
  uint8_t local_8e;
  uint8_t local_8d;
  byte local_8c;
  byte local_8b;
  ushort local_8a;
  ulong local_88;
  uchar *local_80;
  uint8_t *local_78;
  ushort local_70;
  undefined6 uStack_6e;
  ulong local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  DTLSRecordNumber *local_50;
  size_t *local_48;
  uint8_t *local_40;
  uchar *puStack_38;
  
  local_8e = type;
  local_50 = out_number;
  local_48 = out_len;
  sVar11 = dtls_seal_prefix_len(ssl,epoch);
  if ((in < out + max_out && out < in + in_len) && (max_out < sVar11 || out + sVar11 != in)) {
    iVar10 = 0xbd;
    line = 0x1e6;
  }
  else {
    pDVar3 = ssl->d1;
    if (*(uint16_t *)((long)&(pDVar3->write_epoch).next_record.combined_ + 6) == epoch) {
      pDVar16 = &pDVar3->write_epoch;
    }
    else {
      bVar1 = (pDVar3->extra_write_epochs).size_;
      if (bVar1 != 0) {
        lVar14 = 0;
        do {
          pDVar16 = *(DTLSWriteEpoch **)((pDVar3->extra_write_epochs).storage_ + lVar14);
          if (*(uint16_t *)((long)&(pDVar16->next_record).combined_ + 6) == epoch)
          goto LAB_00170c41;
          lVar14 = lVar14 + 8;
        } while ((ulong)bVar1 * 8 != lVar14);
      }
      pDVar16 = (DTLSWriteEpoch *)0x0;
    }
LAB_00170c41:
    if (pDVar16 == (DTLSWriteEpoch *)0x0) {
      iVar10 = 0x44;
      line = 0x1ed;
    }
    else {
      local_78 = (uint8_t *)sVar11;
      if (ssl->s3->version == 0) {
        puVar13 = (uchar *)0xd;
      }
      else {
        uVar8 = ssl_protocol_version(ssl);
        puVar13 = (uchar *)0xd;
        if (epoch != 0) {
          puVar13 = (uchar *)((ulong)(uVar8 < 0x304) * 8 + 5);
        }
      }
      uVar4 = (pDVar16->next_record).combined_;
      if ((uVar4 & 0xffffffffffff) == 0xffffffffffff) {
        iVar10 = 0x45;
        line = 0x1f6;
      }
      else {
        local_88 = uVar4;
        local_80 = puVar13;
        if (ssl->s3->version == 0) {
          bVar7 = false;
        }
        else {
          uVar8 = ssl_protocol_version(ssl);
          bVar7 = epoch != 0 && 0x303 < uVar8;
        }
        local_68 = (ulong)bVar7;
        local_58 = &local_8e;
        if (bVar7 == false) {
          local_58 = (uint8_t *)0x0;
        }
        bVar7 = SSLAEADContext::CiphertextLen
                          ((pDVar16->aead)._M_t.
                           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,
                           (size_t *)&local_70,in_len,local_68);
        if (bVar7) {
          if (local_80 + CONCAT62(uStack_6e,local_70) <= max_out) {
            if (ssl->s3->version == 0) {
              uVar8 = 0xfeff;
            }
            else {
              uVar9 = ssl_protocol_version(ssl);
              uVar8 = 0xfefd;
              if (uVar9 < 0x304) {
                uVar8 = ssl->s3->version;
              }
            }
            if (local_68 == 0) {
              *out = local_8e;
              *(uint16_t *)(out + 1) = uVar8 << 8 | uVar8 >> 8;
              *(ulong *)(out + 3) =
                   local_88 >> 0x38 | (local_88 & 0xff000000000000) >> 0x28 |
                   (local_88 & 0xff0000000000) >> 0x18 | (local_88 & 0xff00000000) >> 8 |
                   (local_88 & 0xff000000) << 8 | (local_88 & 0xff0000) << 0x18 |
                   (local_88 & 0xff00) << 0x28 | local_88 << 0x38;
              puVar12 = (ushort *)(out + 0xb);
            }
            else {
              *out = (byte)epoch & 3 | 0x2c;
              uVar2 = (ushort)(pDVar16->next_record).combined_;
              *(ushort *)(out + 1) = uVar2 << 8 | uVar2 >> 8;
              puVar12 = (ushort *)(out + 3);
            }
            *puVar12 = local_70 << 8 | local_70 >> 8;
            this = (pDVar16->aead)._M_t.
                   super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
            out_00 = out + (long)local_78;
            local_78 = out_00 + in_len;
            seqnum = local_88;
            out_prefix = out + (long)local_80;
            type_00 = local_8e;
            if (ssl->s3->version != 0) {
              local_8d = local_8e;
              local_8a = uVar8;
              local_60 = out + (long)local_80;
              uVar9 = ssl_protocol_version(ssl);
              seqnum = uVar4 & 0xffffffffffff;
              out_prefix = local_60;
              uVar8 = local_8a;
              type_00 = local_8d;
              if (uVar9 < 0x304) {
                seqnum = local_88;
              }
            }
            uVar4 = local_68;
            uVar15 = (ulong)uVar8;
            header.size_ = (size_t)local_80;
            header.data_ = out;
            local_40 = out;
            puStack_38 = local_80;
            bVar7 = SSLAEADContext::SealScatter
                              (this,out_prefix,out_00,local_78,type_00,uVar8,seqnum,header,in,in_len
                               ,local_58,local_68);
            psVar6 = local_48;
            if (!bVar7) {
              return false;
            }
            if (uVar4 != 0) {
              pRVar5 = (pDVar16->rn_encrypter)._M_t.
                       super___uniq_ptr_impl<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_bssl::RecordNumberEncrypter_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_bssl::RecordNumberEncrypter_*,_false>._M_head_impl;
              iVar10 = (*pRVar5->_vptr_RecordNumberEncrypter[4])
                                 (pRVar5,&local_8c,2,out_prefix,CONCAT62(uStack_6e,local_70));
              if ((char)iVar10 == '\0') {
                return false;
              }
              out[1] = out[1] ^ local_8c;
              out[2] = out[2] ^ local_8b;
            }
            local_50->combined_ = local_88;
            (pDVar16->next_record).combined_ = local_88 + 1;
            *psVar6 = (size_t)(local_80 + CONCAT62(uStack_6e,local_70));
            in_00.size_ = uVar15;
            in_00.data_ = local_80;
            ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x100,(int)out,in_00);
            return true;
          }
          iVar10 = 0x79;
          line = 0x209;
        }
        else {
          iVar10 = 200;
          line = 0x205;
        }
      }
    }
  }
  ERR_put_error(0x10,0,iVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                ,line);
  return false;
}

Assistant:

bool dtls_seal_record(SSL *ssl, DTLSRecordNumber *out_number, uint8_t *out,
                      size_t *out_len, size_t max_out, uint8_t type,
                      const uint8_t *in, size_t in_len, uint16_t epoch) {
  const size_t prefix = dtls_seal_prefix_len(ssl, epoch);
  if (buffers_alias(in, in_len, out, max_out) &&
      (max_out < prefix || out + prefix != in)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_OUTPUT_ALIASES_INPUT);
    return false;
  }

  // Determine the parameters for the current epoch.
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t record_header_len = dtls_record_header_write_len(ssl, epoch);

  // Ensure the sequence number update does not overflow.
  DTLSRecordNumber record_number = write_epoch->next_record;
  if (!record_number.HasNext()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  bool dtls13_header = use_dtls13_record_header(ssl, epoch);
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (dtls13_header) {
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t ciphertext_len;
  if (!write_epoch->aead->CiphertextLen(&ciphertext_len, in_len,
                                        extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (max_out < record_header_len + ciphertext_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  uint16_t record_version = dtls_record_version(ssl);
  if (dtls13_header) {
    // The first byte of the DTLS 1.3 record header has the following format:
    // 0 1 2 3 4 5 6 7
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|C|S|L|E E|
    // +-+-+-+-+-+-+-+-+
    //
    // We set C=0 (no Connection ID), S=1 (16-bit sequence number), L=1 (length
    // is present), which is a mask of 0x2c. The E E bits are the low-order two
    // bits of the epoch.
    //
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|0|1|1|E E|
    // +-+-+-+-+-+-+-+-+
    out[0] = 0x2c | (epoch & 0x3);
    // We always use a two-byte sequence number. A one-byte sequence number
    // would require coordinating with the application on ACK feedback to know
    // that the peer is not too far behind.
    CRYPTO_store_u16_be(out + 1, write_epoch->next_record.sequence());
    // TODO(crbug.com/42290594): When we know the record is last in the packet,
    // omit the length.
    CRYPTO_store_u16_be(out + 3, ciphertext_len);
  } else {
    out[0] = type;
    CRYPTO_store_u16_be(out + 1, record_version);
    CRYPTO_store_u64_be(out + 3, record_number.combined());
    CRYPTO_store_u16_be(out + 11, ciphertext_len);
  }
  Span<const uint8_t> header(out, record_header_len);

  if (!write_epoch->aead->SealScatter(
          out + record_header_len, out + prefix, out + prefix + in_len, type,
          record_version, dtls_aead_sequence(ssl, record_number), header, in,
          in_len, extra_in, extra_in_len)) {
    return false;
  }

  // Perform record number encryption (RFC 9147 section 4.2.3).
  if (dtls13_header) {
    // Record number encryption uses bytes from the ciphertext as a sample to
    // generate the mask used for encryption. For simplicity, pass in the whole
    // ciphertext as the sample - GenerateRecordNumberMask will read only what
    // it needs (and error if |sample| is too short).
    Span<const uint8_t> sample(out + record_header_len, ciphertext_len);
    uint8_t mask[2];
    if (!write_epoch->rn_encrypter->GenerateMask(mask, sample)) {
      return false;
    }
    out[1] ^= mask[0];
    out[2] ^= mask[1];
  }

  *out_number = record_number;
  write_epoch->next_record = record_number.Next();
  *out_len = record_header_len + ciphertext_len;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}